

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetUnowned_Test::
~MicroStringPrevTest_SetUnowned_Test(MicroStringPrevTest_SetUnowned_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_SetUnowned_Test::
  ~MicroStringPrevTest_SetUnowned_Test((MicroStringPrevTest_SetUnowned_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetUnowned) {
  static constexpr auto kUnownedPayload =
      MicroString::MakeUnownedPayload("This one is unowned.");

  const size_t used = arena_space_used();
  str_.SetUnowned(kUnownedPayload, arena());
  auto out = str_.Get();
  // Don't use op==, we want to check it points to the exact same buffer.
  EXPECT_EQ(out.data(), kUnownedPayload.payload.payload);
  EXPECT_EQ(out.size(), kUnownedPayload.payload.size);

  // Never uses more memory.
  ExpectMemoryUsed(used, false, 0);
}